

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O1

Aig_Obj_t * Aig_ManDupDfs_rec(Aig_Man_t *pNew,Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t **ppAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  ulong uVar6;
  Aig_Obj_t *p1;
  
  pAVar5 = (Aig_Obj_t *)(pObj->field_5).pData;
  if (pAVar5 == (Aig_Obj_t *)0x0) {
    ppAVar3 = p->pEquivs;
    if ((ppAVar3 == (Aig_Obj_t **)0x0) || (ppAVar3[pObj->Id] == (Aig_Obj_t *)0x0)) {
      pAVar4 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar4 = Aig_ManDupDfs_rec(pNew,p,ppAVar3[pObj->Id]);
    }
    Aig_ManDupDfs_rec(pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    if ((*(uint *)&pObj->field_0x18 & 7) == 4) {
      if (((ulong)pObj & 1) != 0) {
LAB_005f9835:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar6 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        pAVar5 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar5 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar6 + 0x28));
      }
    }
    else {
      Aig_ManDupDfs_rec(pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
      if (((ulong)pObj & 1) != 0) goto LAB_005f9835;
      uVar6 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        pAVar5 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar5 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar6 + 0x28));
      }
      uVar6 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar6 + 0x28));
      }
      pAVar5 = Aig_Oper(pNew,pAVar5,p1,*(Aig_Type_t *)&pObj->field_0x18 & AIG_OBJ_VOID);
      if (pAVar4 != (Aig_Obj_t *)0x0) {
        iVar1 = ((Aig_Obj_t *)((ulong)pAVar4 & 0xfffffffffffffffe))->Id;
        iVar2 = ((Aig_Obj_t *)((ulong)pAVar5 & 0xfffffffffffffffe))->Id;
        if (iVar2 <= iVar1) {
          __assert_fail("Aig_Regular(pEquivNew)->Id < Aig_Regular(pObjNew)->Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                        ,0x21f,"Aig_Obj_t *Aig_ManDupDfs_rec(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *)"
                       );
        }
        if (pNew->pEquivs != (Aig_Obj_t **)0x0) {
          pNew->pEquivs[iVar2] = (Aig_Obj_t *)((ulong)pAVar4 & 0xfffffffffffffffe);
        }
        if (pNew->pReprs != (Aig_Obj_t **)0x0) {
          pNew->pReprs[iVar1] = (Aig_Obj_t *)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
      }
    }
    (pObj->field_5).pData = pAVar5;
  }
  return pAVar5;
}

Assistant:

Aig_Obj_t * Aig_ManDupDfs_rec( Aig_Man_t * pNew, Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pObjNew, * pEquivNew = NULL;
    if ( pObj->pData )
        return (Aig_Obj_t *)pObj->pData;
    if ( p->pEquivs && Aig_ObjEquiv(p, pObj) )
        pEquivNew = Aig_ManDupDfs_rec( pNew, p, Aig_ObjEquiv(p, pObj) );
    Aig_ManDupDfs_rec( pNew, p, Aig_ObjFanin0(pObj) );
    if ( Aig_ObjIsBuf(pObj) )
        return (Aig_Obj_t *)(pObj->pData = Aig_ObjChild0Copy(pObj));
    Aig_ManDupDfs_rec( pNew, p, Aig_ObjFanin1(pObj) );
    pObjNew = Aig_Oper( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj), Aig_ObjType(pObj) );
    if ( pEquivNew )
    {
        assert( Aig_Regular(pEquivNew)->Id < Aig_Regular(pObjNew)->Id );
        if ( pNew->pEquivs )
            pNew->pEquivs[Aig_Regular(pObjNew)->Id] = Aig_Regular(pEquivNew);        
        if ( pNew->pReprs )
            pNew->pReprs[Aig_Regular(pEquivNew)->Id] = Aig_Regular(pObjNew);
    }
    return (Aig_Obj_t *)(pObj->pData = pObjNew);
}